

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecognitionException.cpp
# Opt level: O0

void __thiscall
antlr::RecognitionException::RecognitionException(RecognitionException *this,string *s)

{
  ANTLRException *in_RSI;
  string *in_RDI;
  
  ANTLRException::ANTLRException(in_RSI,in_RDI);
  *(undefined ***)in_RDI = &PTR__RecognitionException_0050d580;
  std::__cxx11::string::string((string *)&in_RDI[1]._M_string_length);
  *(undefined4 *)&in_RDI[2]._M_string_length = 0xffffffff;
  *(undefined4 *)((long)&in_RDI[2]._M_string_length + 4) = 0xffffffff;
  return;
}

Assistant:

RecognitionException::RecognitionException(const ANTLR_USE_NAMESPACE(std)string& s)
: ANTLRException(s)
, line(-1)
, column(-1)
{
}